

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O2

uint32 Clasp::StatisticObject::registerArray<Clasp::ClaspStatistics::Impl::Arr>(void)

{
  int iVar1;
  I *unaff_RBX;
  
  if (registerArray<Clasp::ClaspStatistics::Impl::Arr>()::vtab_s == '\0') {
    iVar1 = __cxa_guard_acquire(&registerArray<Clasp::ClaspStatistics::Impl::Arr>()::vtab_s);
    if (iVar1 != 0) {
      registerArray<Clasp::ClaspStatistics::Impl::Arr>::vtab_s.super_A.super_I.type.val_ =
           (Type)Array;
      registerArray<Clasp::ClaspStatistics::Impl::Arr>::vtab_s.super_A.size =
           registerArray<Clasp::ClaspStatistics::Impl::Arr>::Array_T::size;
      registerArray<Clasp::ClaspStatistics::Impl::Arr>::vtab_s.super_A.at =
           registerArray<Clasp::ClaspStatistics::Impl::Arr>::Array_T::at;
      __cxa_guard_release(&registerArray<Clasp::ClaspStatistics::Impl::Arr>()::vtab_s);
    }
  }
  if (registerArray<Clasp::ClaspStatistics::Impl::Arr>()::id == '\0') {
    iVar1 = __cxa_guard_acquire(&registerArray<Clasp::ClaspStatistics::Impl::Arr>()::id);
    if (iVar1 != 0) {
      registerArray<Clasp::ClaspStatistics::Impl::Arr>::id = registerType(unaff_RBX);
      __cxa_guard_release(&registerArray<Clasp::ClaspStatistics::Impl::Arr>()::id);
    }
  }
  return registerArray<Clasp::ClaspStatistics::Impl::Arr>::id;
}

Assistant:

uint32 StatisticObject::registerArray() {
	static const struct Array_T : A {
		Array_T() : A(&Array_T::size, &Array_T::at) {}
		static uint32          size(ObjPtr obj)         { return toU32(static_cast<const T*>(obj)->size()); }
		static StatisticObject at(ObjPtr obj, uint32 i) { return static_cast<const T*>(obj)->at(i); }
	} vtab_s;
	static const uint32 id = registerType(&vtab_s);
	return id;
}